

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* FIX::string_split(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *value,char delimiter)

{
  size_t sVar1;
  string *psVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  value_type local_90;
  _Base_ptr local_70;
  undefined1 local_68;
  value_type local_50;
  ulong local_30;
  size_t pos;
  size_t start;
  string *psStack_18;
  char delimiter_local;
  string *value_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *subStrings;
  
  start._6_1_ = 0;
  start._7_1_ = delimiter;
  psStack_18 = value;
  value_local = (string *)__return_storage_ptr__;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  pos = 0;
  for (local_30 = 0; uVar5 = local_30, uVar3 = std::__cxx11::string::size(), sVar1 = pos,
      uVar5 < uVar3; local_30 = local_30 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    if (*pcVar4 == start._7_1_) {
      if (1 < local_30 - pos) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)psStack_18);
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(__return_storage_ptr__,&local_50);
        local_70 = (_Base_ptr)pVar6.first._M_node;
        local_68 = pVar6.second;
        std::__cxx11::string::~string((string *)&local_50);
      }
      pos = local_30 + 1;
    }
  }
  uVar5 = std::__cxx11::string::size();
  psVar2 = psStack_18;
  if (sVar1 < uVar5) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_90,(ulong)psVar2);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> string_split(const std::string &value, const char delimiter) {
  std::set<std::string> subStrings;
  std::size_t start = 0;
  for (std::size_t pos = 0; pos < value.size(); ++pos) {
    if (value[pos] == delimiter) {
      if (pos - start > 1) {
        subStrings.insert(value.substr(start, pos - start));
      }
      start = pos + 1;
    }
  }
  if (start < value.size()) {
    subStrings.insert(value.substr(start, value.size() - start));
  }
  return subStrings;
}